

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_list.c
# Opt level: O0

exr_result_t exr_attr_chlist_init(exr_context_t ctxt,exr_attr_chlist_t *clist,int nchans)

{
  exr_result_t eVar1;
  int in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  _internal_exr_context *pctxt;
  exr_attr_chlist_entry_t *nlist;
  exr_attr_chlist_t nil;
  long local_38;
  undefined8 local_30;
  undefined8 local_28;
  int local_1c;
  undefined8 *local_18;
  long local_10;
  exr_result_t local_4;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_30,0,0x10);
  if (local_10 == 0) {
    local_4 = 2;
  }
  else if (local_18 == (undefined8 *)0x0) {
    local_4 = (**(code **)(local_10 + 0x40))
                        (local_10,3,"Invalid channel list pointer to chlist_add_with_length");
  }
  else if (local_1c < 0) {
    local_4 = (**(code **)(local_10 + 0x48))
                        (local_10,3,"Negative number of channels requested (%d)",local_1c);
  }
  else {
    *local_18 = local_30;
    local_18[1] = local_28;
    if (local_1c < 1) {
      local_38 = 0;
    }
    else {
      local_38 = (**(code **)(local_10 + 0x58))((long)local_1c << 5);
      if (local_38 == 0) {
        eVar1 = (**(code **)(local_10 + 0x38))(local_10,1);
        return eVar1;
      }
    }
    local_18[1] = local_38;
    *(int *)((long)local_18 + 4) = local_1c;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

exr_result_t
exr_attr_chlist_init (exr_context_t ctxt, exr_attr_chlist_t* clist, int nchans)
{
    exr_attr_chlist_t        nil = {0};
    exr_attr_chlist_entry_t* nlist;

    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (!clist)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid channel list pointer to chlist_add_with_length");

    if (nchans < 0)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Negative number of channels requested (%d)",
            nchans);

    *clist = nil;

    if (nchans > 0)
    {
        nlist = (exr_attr_chlist_entry_t*) pctxt->alloc_fn (
            sizeof (*nlist) * (size_t) nchans);
        if (nlist == NULL)
            return pctxt->standard_error (pctxt, EXR_ERR_OUT_OF_MEMORY);
    }
    else
        nlist = NULL;
    clist->entries     = nlist;
    clist->num_alloced = nchans;
    return EXR_ERR_SUCCESS;
}